

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

int dlposix_memalign(void **pp,size_t alignment,size_t bytes)

{
  int iVar1;
  void *pvVar2;
  mstate m;
  
  if (alignment == 0x10) {
    pvVar2 = dlmalloc(bytes);
  }
  else {
    if (alignment < 8 || (alignment & 7) != 0) {
      return 0x16;
    }
    if ((alignment >> 3 & (alignment >> 3) - 1) != 0) {
      return 0x16;
    }
    if (-alignment - 0x80 < bytes) {
      return 0xc;
    }
    m = (mstate)&DAT_00000020;
    if (0x20 < alignment) {
      m = (mstate)alignment;
    }
    pvVar2 = internal_memalign(m,bytes,bytes);
  }
  if (pvVar2 == (void *)0x0) {
    iVar1 = 0xc;
  }
  else {
    *pp = pvVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int dlposix_memalign(void** pp, size_t alignment, size_t bytes) {
  void* mem = 0;
  if (alignment == MALLOC_ALIGNMENT)
    mem = dlmalloc(bytes);
  else {
    size_t d = alignment / sizeof(void*);
    size_t r = alignment % sizeof(void*);
    if (r != 0 || d == 0 || (d & (d-SIZE_T_ONE)) != 0)
      return EINVAL;
    else if (bytes <= MAX_REQUEST - alignment) {
      if (alignment <  MIN_CHUNK_SIZE)
        alignment = MIN_CHUNK_SIZE;
      mem = internal_memalign(gm, alignment, bytes);
    }
  }
  if (mem == 0)
    return ENOMEM;
  else {
    *pp = mem;
    return 0;
  }
}